

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::make_item_matchcase
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  char *pcVar1;
  pointer pCVar2;
  char *pcVar3;
  
  if (this->case_sensitive_ == false) {
    pCVar2 = (this->props_).
             super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar3 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
      if (pCVar2->uppercase == true) {
        *pcVar3 = *pcVar3 + ' ';
      }
      pCVar2 = pCVar2 + 1;
    }
  }
  return;
}

Assistant:

void make_item_matchcase() {
    if (!case_sensitive_) {
      auto props_it = props_.cbegin();
      for (auto item_it = item_.begin(), item_last = item_.end();
           item_it != item_last; ++item_it, ++props_it) {
        if (props_it->uppercase) {
          *item_it = StringTraits::uppercase_to_lowercase(*item_it);
        }
      }
    }
  }